

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharInfo.h
# Opt level: O0

char * slang::utf8Decode(char *b,uint32_t *c,int *e)

{
  int iVar1;
  char *next;
  undefined8 uStack_98;
  int len;
  int shifte [5];
  int shiftc [5];
  uint32_t mins [5];
  int masks [5];
  int *e_local;
  uint32_t *c_local;
  char *b_local;
  
  masks[0] = 0x1f;
  masks[1] = 0xf;
  masks[2] = 7;
  mins[0] = 0x80;
  mins[1] = 0x800;
  mins[2] = 0x10000;
  shiftc[0] = 0xc;
  shiftc[1] = 6;
  shiftc[2] = 0;
  uStack_98 = 0x600000000;
  shifte[0] = 4;
  shifte[1] = 2;
  shifte[2] = 0;
  unique0x10000109 = (uint *)e;
  iVar1 = utf8Len(*b);
  *c = ((uint)(byte)*b & masks[(long)iVar1 + -2]) << 0x12;
  *c = ((byte)b[1] & 0x3f) << 0xc | *c;
  *c = ((byte)b[2] & 0x3f) << 6 | *c;
  *c = (byte)b[3] & 0x3f | *c;
  *c = *c >> ((byte)shiftc[(long)iVar1 + -2] & 0x1f);
  *stack0xffffffffffffffe0 = (uint)(*c < mins[(long)iVar1 + -2]) << 6;
  *stack0xffffffffffffffe0 = (uint)(*c >> 0xb == 0x1b) << 7 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = (uint)(0x10ffff < *c) << 8 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = (int)((byte)b[1] & 0xc0) >> 2 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = (int)((byte)b[2] & 0xc0) >> 4 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = (int)(uint)(byte)b[3] >> 6 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 ^ 0x2a;
  *stack0xffffffffffffffe0 =
       (int)*stack0xffffffffffffffe0 >>
       ((byte)*(undefined4 *)((long)&stack0xffffffffffffff68 + (long)iVar1 * 4) & 0x1f);
  return b + (long)(int)(uint)((iVar1 != 0 ^ 0xffU) & 1) + (long)iVar1;
}

Assistant:

constexpr const char* utf8Decode(const char* b, uint32_t* c, int* e) {
    constexpr const int masks[] = {0x00, 0x7f, 0x1f, 0x0f, 0x07};
    constexpr const uint32_t mins[] = {4194304, 0, 128, 2048, 65536};
    constexpr const int shiftc[] = {0, 18, 12, 6, 0};
    constexpr const int shifte[] = {0, 6, 4, 2, 0};

    using uc = unsigned char;
    int len = utf8Len(uc(*b));

    // Compute the pointer to the next character early so that the next
    // iteration can start working on the next character. Neither Clang
    // nor GCC figure out this reordering on their own.
    const char* next = b + len + !len;

    // Assume a four-byte character and load four bytes. Unused bits are
    // shifted out.
    *c = (uint32_t)(uc(b[0]) & masks[len]) << 18;
    *c |= (uint32_t)(uc(b[1]) & 0x3f) << 12;
    *c |= (uint32_t)(uc(b[2]) & 0x3f) << 6;
    *c |= (uint32_t)(uc(b[3]) & 0x3f) << 0;
    *c >>= shiftc[len];

    // Accumulate the various error conditions.
    *e = (*c < mins[len]) << 6;      // non-canonical encoding
    *e |= ((*c >> 11) == 0x1b) << 7; // surrogate half?
    *e |= (*c > 0x10FFFF) << 8;      // out of range?
    *e |= (uc(b[1]) & 0xc0) >> 2;
    *e |= (uc(b[2]) & 0xc0) >> 4;
    *e |= (uc(b[3])) >> 6;
    *e ^= 0x2a; // top two bits of each tail byte correct?
    *e >>= shifte[len];

    return next;
}